

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O1

int jpc_dec_process_rgn(jpc_dec_t *dec,jpc_ms_t *ms)

{
  uint_fast16_t uVar1;
  jpc_dec_tile_t *pjVar2;
  jpc_dec_cp_t *pjVar3;
  
  uVar1 = (ms->parms).sot.tileno;
  if (dec->numcomps <= (int)uVar1) {
    jas_eprintf("invalid component number in RGN marker segment\n");
    return -1;
  }
  if (dec->state == 0x10) {
    pjVar2 = dec->curtile;
    if (pjVar2 == (jpc_dec_tile_t *)0x0) {
      return -1;
    }
    if (0 < pjVar2->partno) {
      return -1;
    }
    pjVar3 = pjVar2->cp;
  }
  else {
    if (dec->state != 4) {
      return 0;
    }
    pjVar3 = dec->cp;
  }
  pjVar3->ccps[uVar1].roishift = (ms->parms).coc.compparms.numdlvls;
  return 0;
}

Assistant:

static int jpc_dec_process_rgn(jpc_dec_t *dec, jpc_ms_t *ms)
{
	jpc_rgn_t *rgn = &ms->parms.rgn;
	jpc_dec_tile_t *tile;

	if (JAS_CAST(int, rgn->compno) >= dec->numcomps) {
		jas_eprintf("invalid component number in RGN marker segment\n");
		return -1;
	}
	switch (dec->state) {
	case JPC_MH:
		jpc_dec_cp_setfromrgn(dec->cp, rgn);
		break;
	case JPC_TPH:
		if (!(tile = dec->curtile)) {
			return -1;
		}
		if (tile->partno > 0) {
			return -1;
		}
		jpc_dec_cp_setfromrgn(tile->cp, rgn);
		break;
	}

	return 0;
}